

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

void __thiscall
FTraceInfo::EnterSectorPortal
          (FTraceInfo *this,FPathTraverse *pt,int position,double frac,sector_t_conflict *entersec)

{
  sector_t_conflict *psVar1;
  FSectorPortal *pFVar2;
  TVector2<double> local_a0;
  undefined1 local_90 [8];
  DVector3 enter;
  undefined1 local_60 [8];
  DVector3 exit;
  double enterdist;
  DVector2 displacement;
  sector_t_conflict *entersec_local;
  double frac_local;
  int position_local;
  FPathTraverse *pt_local;
  FTraceInfo *this_local;
  
  displacement.Y = (double)entersec;
  sector_t::GetPortalDisplacement((sector_t *)&enterdist,(int)entersec);
  exit.Z = this->MaxDist * frac;
  ::operator*((TVector3<double> *)&enter.Z,exit.Z,&this->Vec);
  TVector3<double>::operator+
            ((TVector3<double> *)local_60,&this->Start,(TVector3<double> *)&enter.Z);
  operator+((TVector3<double> *)local_90,(TVector3<double> *)local_60,(Vector2 *)&enterdist);
  TVector3<double>::operator+=(&this->Start,(Vector2 *)&enterdist);
  TVector2<double>::TVector2(&local_a0,(TVector3<double> *)local_90);
  psVar1 = (sector_t_conflict *)P_PointInSector(&local_a0);
  this->CurSector = psVar1;
  this->inshootthrough = 1;
  this->startfrac = frac;
  this->EnterDist = exit.Z;
  pFVar2 = sector_t::GetPortal((sector_t *)displacement.Y,position);
  FPathTraverse::PortalRelocate(pt,&pFVar2->mDisplacement,this->ptflags,frac);
  if (((this->TraceFlags & 0x10) != 0) &&
     (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    exit.Z = this->MaxDist * frac;
    this->Results->HitType = TRACE_CrossingPortal;
    TVector3<double>::operator=(&this->Results->HitPos,(TVector3<double> *)local_60);
    TVector3<double>::operator=(&this->Results->SrcFromTarget,(TVector3<double> *)local_90);
    TVector3<double>::operator=(&this->Results->HitVector,&this->Vec);
    (*this->TraceCallback)(this->Results,this->TraceCallbackData);
  }
  Setup3DFloors(this);
  return;
}

Assistant:

void FTraceInfo::EnterSectorPortal(FPathTraverse &pt, int position, double frac, sector_t *entersec)
{
	DVector2 displacement = entersec->GetPortalDisplacement(position);;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + enterdist * Vec;
	DVector3 enter = exit + displacement;

	Start += displacement;
	CurSector = P_PointInSector(enter);
	inshootthrough = true;
	startfrac = frac;
	EnterDist = enterdist;
	pt.PortalRelocate(entersec->GetPortal(position)->mDisplacement, ptflags, frac);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		Results->SrcFromTarget = enter;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}

	Setup3DFloors();
}